

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZProjectEllipse.cpp
# Opt level: O2

void __thiscall
TPZProjectEllipse::PrintAxes(TPZProjectEllipse *this,TPZFMatrix<double> *P,ostream *out)

{
  ostream *poVar1;
  int j;
  long lVar2;
  long lVar3;
  double extraout_XMM0_Qa;
  
  std::operator<<(out,"\nPrinting axes of the ellipse:\n");
  AlmostZeroToZero(this,P);
  lVar3 = 0;
  while (lVar3 < (P->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) {
    poVar1 = std::operator<<(out,"Vector");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(lVar3 + 1));
    std::operator<<(poVar1," = ( ");
    for (lVar2 = 0; lVar2 < (P->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow; lVar2 = lVar2 + 1
        ) {
      if (lVar2 != 0) {
        std::operator<<(out," , ");
      }
      (*(P->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (P,lVar2,lVar3);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    }
    std::operator<<(out," )\n");
    lVar3 = lVar3 + 1;
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void TPZProjectEllipse::PrintAxes(TPZFMatrix<REAL> &P,std::ostream &out) {
	out << "\nPrinting axes of the ellipse:\n";
	AlmostZeroToZero(P);
	for(int i=0;i<P.Cols();i++) {
		out << "Vector" << i+1 << " = ( ";
		for(int j=0;j<P.Rows();j++) {
			if(j) out << " , ";
			out << P.GetVal(j,i);
		}
		out << " )\n";
	}
	out << std::endl;
}